

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
map_caster<std::unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>,_kratos::Stmt_*,_unsigned_int>
::load(map_caster<std::unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>,_kratos::Stmt_*,_unsigned_int>
       *this,handle src,bool convert)

{
  bool bVar1;
  PyObject **ppPVar2;
  template_cast_op_type<typename_std::add_rvalue_reference<unsigned_int_&&>::type> __args_1;
  reference rVar3;
  template_cast_op_type<typename_std::add_rvalue_reference<Stmt_*&&>::type> local_e8;
  undefined4 local_dc;
  handle local_d8;
  handle local_d0;
  type_caster<unsigned_int,_void> local_c4;
  undefined1 local_c0 [4];
  value_conv vconv;
  key_conv kconv;
  value_type it;
  dict_iterator __end3;
  undefined1 local_68 [8];
  dict_iterator __begin3;
  dict *__range3;
  dict local_38;
  dict d;
  bool convert_local;
  map_caster<std::unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>,_kratos::Stmt_*,_unsigned_int>
  *this_local;
  handle src_local;
  
  d.super_object.super_handle.m_ptr = (object)(object)src.m_ptr;
  bVar1 = isinstance<pybind11::dict,_0>(src);
  if (bVar1) {
    reinterpret_borrow<pybind11::dict>((pybind11 *)&local_38,src);
    std::
    unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>
    ::clear(&this->value);
    __begin3.super_dict_readonly.pos = (ssize_t)&local_38;
    dict::begin((dict_iterator *)local_68,&local_38);
    dict::end((dict_iterator *)&it.second,(dict *)__begin3.super_dict_readonly.pos);
    while (bVar1 = detail::operator!=((It *)local_68,(It *)&it.second), bVar1) {
      rVar3 = generic_iterator<pybind11::detail::iterator_policies::dict_readonly>::operator*
                        ((generic_iterator<pybind11::detail::iterator_policies::dict_readonly> *)
                         local_68);
      it.first = rVar3.second.m_ptr;
      kconv.super_type_caster_base<kratos::Stmt>.super_type_caster_generic.value =
           (void *)rVar3.first.m_ptr;
      type_caster<kratos::Stmt,_void>::type_caster((type_caster<kratos::Stmt,_void> *)local_c0);
      ppPVar2 = pybind11::handle::ptr
                          ((handle *)
                           &kconv.super_type_caster_base<kratos::Stmt>.super_type_caster_generic.
                            value);
      pybind11::handle::handle(&local_d0,*ppPVar2);
      bVar1 = type_caster_generic::load((type_caster_generic *)local_c0,local_d0,convert);
      if (!bVar1) {
LAB_0088d4d5:
        src_local.m_ptr._7_1_ = false;
        goto LAB_0088d5a9;
      }
      ppPVar2 = pybind11::handle::ptr(&it.first);
      pybind11::handle::handle(&local_d8,*ppPVar2);
      bVar1 = type_caster<unsigned_int,_void>::load(&local_c4,local_d8,convert);
      if (!bVar1) goto LAB_0088d4d5;
      local_e8 = cast_op<kratos::Stmt*&&>((make_caster<kratos::Stmt_*&&> *)local_c0);
      __args_1 = cast_op<unsigned_int&&>(&local_c4);
      std::
      unordered_map<kratos::Stmt*,unsigned_int,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<std::pair<kratos::Stmt*const,unsigned_int>>>
      ::emplace<kratos::Stmt*,unsigned_int>
                ((unordered_map<kratos::Stmt*,unsigned_int,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<std::pair<kratos::Stmt*const,unsigned_int>>>
                  *)this,&local_e8,__args_1);
      generic_iterator<pybind11::detail::iterator_policies::dict_readonly>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::dict_readonly> *)local_68);
    }
    src_local.m_ptr._7_1_ = true;
LAB_0088d5a9:
    local_dc = 1;
    dict::~dict(&local_38);
  }
  else {
    src_local.m_ptr._7_1_ = false;
  }
  return src_local.m_ptr._7_1_;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<dict>(src))
            return false;
        auto d = reinterpret_borrow<dict>(src);
        value.clear();
        for (auto it : d) {
            key_conv kconv;
            value_conv vconv;
            if (!kconv.load(it.first.ptr(), convert) ||
                !vconv.load(it.second.ptr(), convert))
                return false;
            value.emplace(cast_op<Key &&>(std::move(kconv)), cast_op<Value &&>(std::move(vconv)));
        }
        return true;
    }